

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O2

void device_reset_k051649(void *chip)

{
  long lVar1;
  
  for (lVar1 = 8; lVar1 != 0xe4; lVar1 = lVar1 + 0x2c) {
    *(undefined2 *)((long)chip + lVar1 + 8) = 0;
    *(undefined8 *)((long)chip + lVar1) = 0;
  }
  *(undefined2 *)((long)chip + 0x100) = 0;
  return;
}

Assistant:

static void device_reset_k051649(void *chip)
{
	k051649_state *info = (k051649_state *)chip;
	k051649_sound_channel *voice = info->channel_list;
	int i;

	// reset all the voices
	for (i = 0; i < 5; i++)
	{
		voice[i].frequency = 0;
		voice[i].volume = 0;
		voice[i].counter = 0;
		voice[i].key = 0;
	}
	
	// other parameters
	info->test = 0x00;
	info->cur_reg = 0x00;
	
	return;
}